

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

int16_t av1_mode_context_analyzer(int16_t *mode_context,MV_REFERENCE_FRAME *rf)

{
  int8_t iVar1;
  ushort uVar2;
  long in_RSI;
  long in_RDI;
  int16_t comp_ctx;
  int16_t refmv_ctx;
  int16_t newmv_ctx;
  int8_t ref_frame;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffc8;
  int local_2c;
  uint16_t local_2;
  
  iVar1 = av1_ref_frame_type(in_stack_ffffffffffffffc8);
  if (*(char *)(in_RSI + 1) < '\x01') {
    local_2 = *(uint16_t *)(in_RDI + (long)iVar1 * 2);
  }
  else {
    uVar2 = *(ushort *)(in_RDI + (long)iVar1 * 2) & 7;
    if (uVar2 < 4) {
      local_2c = (int)(short)uVar2;
    }
    else {
      local_2c = 4;
    }
    local_2 = compound_mode_ctx_map
              [(int)(short)(*(short *)(in_RDI + (long)iVar1 * 2) >> 4 & 0xf) >> 1][local_2c];
  }
  return local_2;
}

Assistant:

static inline int16_t av1_mode_context_analyzer(
    const int16_t *const mode_context, const MV_REFERENCE_FRAME *const rf) {
  const int8_t ref_frame = av1_ref_frame_type(rf);

  if (rf[1] <= INTRA_FRAME) return mode_context[ref_frame];

  const int16_t newmv_ctx = mode_context[ref_frame] & NEWMV_CTX_MASK;
  const int16_t refmv_ctx =
      (mode_context[ref_frame] >> REFMV_OFFSET) & REFMV_CTX_MASK;

  const int16_t comp_ctx = compound_mode_ctx_map[refmv_ctx >> 1][AOMMIN(
      newmv_ctx, COMP_NEWMV_CTXS - 1)];
  return comp_ctx;
}